

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          Type type,NumericExpr expr)

{
  NumericExpr expr_00;
  MutObjective *in_RCX;
  long *in_RDI;
  MutObjective MVar1;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  MVar1 = BasicProblem<mp::BasicProblemParams<int>_>::obj
                    ((BasicProblem<mp::BasicProblemParams<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  expr_00.super_ExprBase.impl_._4_4_ = in_stack_ffffffffffffffd4;
  expr_00.super_ExprBase.impl_._0_4_ =
       MVar1.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>::
  SetObj<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective>
            ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
             MVar1.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
             in_RCX,(Type)((ulong)in_RDI >> 0x20),expr_00);
  (**(code **)(*in_RDI + 0x20))();
  return;
}

Assistant:

void OnObj(int index, obj::Type type, NumericExpr expr) {
    SetObj(builder_.obj(index), type, expr);
    notify_obj_added();
  }